

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserManager.cpp
# Opt level: O0

void __thiscall phpconvert::ParserManager::parse(ParserManager *this,AppParams *params)

{
  BaseParser *pBVar1;
  string local_68;
  string local_38;
  AppParams *local_18;
  AppParams *params_local;
  ParserManager *this_local;
  
  local_18 = params;
  params_local = (AppParams *)this;
  pBVar1 = getParser(this);
  std::__cxx11::string::string((string *)&local_38,(string *)local_18);
  BaseParser::setSourceDir(pBVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pBVar1 = getParser(this);
  BaseParser::setRecursive(pBVar1,(bool)(local_18->recursive & 1));
  pBVar1 = getParser(this);
  std::__cxx11::string::string((string *)&local_68,(string *)&local_18->outputPath);
  BaseParser::setOutputDir(pBVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pBVar1 = getParser(this);
  (*pBVar1->_vptr_BaseParser[2])();
  return;
}

Assistant:

void ParserManager::parse(AppParams *params) {
        getParser()->setSourceDir(params->path);
        getParser()->setRecursive(params->recursive);
        getParser()->setOutputDir(params->outputPath);
        getParser()->parse();
    }